

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileimagewindow.cc
# Opt level: O0

void __thiscall
bgui::FileImageWindow::load(FileImageWindow *this,uint *pos,bool down,int w,int h,bool size_max)

{
  uint uVar1;
  int iVar2;
  size_type sVar3;
  char *pcVar4;
  Image *pIVar5;
  ImageAdapterBase *pIVar6;
  BaseWindow *this_00;
  BaseWindow *pBVar7;
  Properties *pPVar8;
  int in_ECX;
  byte in_DL;
  uint *in_RSI;
  long in_RDI;
  int in_R8D;
  byte in_R9B;
  bool bVar9;
  char *in_stack_00000098;
  FileImageWindow *in_stack_000000a0;
  char *in_stack_000000a8;
  Properties *in_stack_000000b0;
  int flip;
  int rotation;
  Properties prop;
  Exception *anon_var_0_2;
  ImageFloat *imagefloat;
  Exception *anon_var_0_1;
  ImageU16 *imageu16;
  Exception *anon_var_0;
  ImageU8 *imageu8;
  ImageAdapterBase *adapt;
  undefined8 in_stack_fffffffffffffe38;
  BaseWindow *in_stack_fffffffffffffe40;
  char *in_stack_fffffffffffffe48;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *in_stack_fffffffffffffe50;
  undefined1 in_stack_fffffffffffffe67;
  double in_stack_fffffffffffffe68;
  double in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe78;
  undefined1 f;
  int in_stack_fffffffffffffe7c;
  ImageAdapter<unsigned_char> *in_stack_fffffffffffffe80;
  undefined1 in_stack_fffffffffffffea7;
  int in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeac;
  keep in_stack_fffffffffffffeb0;
  undefined1 in_stack_fffffffffffffeb7;
  ImageAdapterBase *in_stack_fffffffffffffeb8;
  ImageWindow *in_stack_fffffffffffffec0;
  char local_d8 [168];
  char *local_30;
  ImageAdapterBase *local_28;
  byte local_1d;
  int local_1c;
  int local_18;
  byte local_11;
  uint *local_10;
  
  local_11 = in_DL & 1;
  local_1d = in_R9B & 1;
  local_28 = (ImageAdapterBase *)0x0;
  local_1c = in_R8D;
  local_18 = in_ECX;
  local_10 = in_RSI;
  while( true ) {
    iVar2 = (int)((ulong)in_stack_fffffffffffffe38 >> 0x20);
    bVar9 = false;
    if (local_28 == (ImageAdapterBase *)0x0) {
      uVar1 = *local_10;
      sVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(in_RDI + 0x78));
      bVar9 = uVar1 < sVar3;
    }
    if (!bVar9) break;
    local_30 = (char *)0x0;
    pcVar4 = (char *)operator_new(0x38);
    gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::Image
              (in_stack_fffffffffffffe50,(long)in_stack_fffffffffffffe48,
               (long)in_stack_fffffffffffffe40,iVar2);
    local_30 = pcVar4;
    pIVar5 = (Image *)gimage::getImageIO();
    pcVar4 = local_30;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(in_RDI + 0x78),(ulong)*local_10);
    iVar2 = std::__cxx11::string::c_str();
    in_stack_fffffffffffffe40 = (BaseWindow *)0xffffffffffffffff;
    in_stack_fffffffffffffe38 = 0xffffffffffffffff;
    gimage::ImageIO::load(pIVar5,pcVar4,iVar2,1,0,0,-1);
    pIVar6 = (ImageAdapterBase *)operator_new(0xa8);
    ImageAdapter<unsigned_char>::ImageAdapter
              (in_stack_fffffffffffffe80,
               (Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)
               CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
               in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,(bool)in_stack_fffffffffffffe67);
    local_30 = (char *)0x0;
    local_28 = pIVar6;
  }
  if ((*(byte *)(in_RDI + 0xcc) & 1) != 0) {
    BaseWindow::removeFileWatch(in_stack_fffffffffffffe40,iVar2);
    this_00 = (BaseWindow *)(ulong)*local_10;
    pBVar7 = (BaseWindow *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(in_RDI + 0x78));
    if (this_00 < pBVar7) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(in_RDI + 0x78),(ulong)*local_10);
      std::__cxx11::string::c_str();
      iVar2 = BaseWindow::addFileWatch(this_00,in_stack_fffffffffffffe48);
      *(int *)(in_RDI + 0xd0) = iVar2;
    }
    else {
      *(undefined1 *)(in_RDI + 0xcc) = 0;
    }
  }
  f = (undefined1)((uint)in_stack_fffffffffffffe78 >> 0x18);
  if (local_28 == (ImageAdapterBase *)0x0) {
    ImageWindow::setAdapter
              (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,(bool)in_stack_fffffffffffffeb7,
               in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,in_stack_fffffffffffffea8,
               (bool)in_stack_fffffffffffffea7);
  }
  else {
    gutil::Properties::Properties((Properties *)0x13148e);
    pPVar8 = (Properties *)gimage::getImageIO();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(in_RDI + 0x78),(ulong)*local_10);
    std::__cxx11::string::c_str();
    gimage::ImageIO::loadProperties(pPVar8,local_d8);
    gutil::Properties::getValue<int>
              (in_stack_000000b0,in_stack_000000a8,(int *)in_stack_000000a0,in_stack_00000098);
    gutil::Properties::getValue<int>
              (in_stack_000000b0,in_stack_000000a8,(int *)in_stack_000000a0,in_stack_00000098);
    ImageAdapterBase::setRotationFlip
              (&in_stack_fffffffffffffe80->super_ImageAdapterBase,in_stack_fffffffffffffe7c,(bool)f)
    ;
    ImageAdapterBase::setScale(local_28,*(double *)(in_RDI + 0x98));
    if ((*(double *)(in_RDI + 0xa0) < *(double *)(in_RDI + 0xa8)) && (*(int *)(in_RDI + 0xc0) == 2))
    {
      ImageAdapterBase::setMinIntensity(local_28,*(double *)(in_RDI + 0xa0));
      ImageAdapterBase::setMaxIntensity(local_28,*(double *)(in_RDI + 0xa8));
    }
    if ((local_18 < 1) || (local_1c < 1)) {
      if (*(int *)(in_RDI + 0xc0) == 0) {
        ImageAdapterBase::setMapping(local_28,*(mapping *)(in_RDI + 0xc4));
        ImageAdapterBase::setChannel(local_28,*(int *)(in_RDI + 200));
      }
      ImageWindow::setAdapter
                (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,(bool)in_stack_fffffffffffffeb7
                 ,in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,in_stack_fffffffffffffea8,
                 (bool)in_stack_fffffffffffffea7);
    }
    else {
      ImageAdapterBase::setMapping(local_28,*(mapping *)(in_RDI + 0xc4));
      ImageAdapterBase::setChannel(local_28,*(int *)(in_RDI + 200));
      ImageWindow::setAdapter
                (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,(bool)in_stack_fffffffffffffeb7
                 ,in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,in_stack_fffffffffffffea8,
                 (bool)in_stack_fffffffffffffea7);
    }
    gutil::Properties::~Properties((Properties *)0x13173a);
  }
  updateTitle(in_stack_000000a0);
  return;
}

Assistant:

void FileImageWindow::load(unsigned int &pos, bool down, int w, int h, bool size_max)
{
  ImageAdapterBase *adapt=0;

  // load image and store in adatper

  while (adapt == 0 && pos < list.size())
  {
    gimage::ImageU8    *imageu8=0;

    try
    {
      imageu8=new gimage::ImageU8();
      gimage::getImageIO().load(*imageu8, list[pos].c_str());
      adapt=new ImageAdapter<unsigned char>(imageu8, vmin, vmax, true);
      imageu8=0;
    }
    catch (const gutil::Exception &)
    {
      gimage::ImageU16   *imageu16=0;

      delete imageu8;
      imageu8=0;

      try
      {
        imageu16=new gimage::ImageU16();
        gimage::getImageIO().load(*imageu16, list[pos].c_str());
        adapt=new ImageAdapter<unsigned short>(imageu16, vmin, vmax, true);
        imageu16=0;
      }
      catch (const gutil::Exception &)
      {
        gimage::ImageFloat *imagefloat=0;

        delete imageu16;
        imageu16=0;

        try
        {
          imagefloat=new gimage::ImageFloat();
          gimage::getImageIO().load(*imagefloat, list[pos].c_str());
          adapt=new ImageAdapter<float>(imagefloat, vmin, vmax, true);
          imagefloat=0;
        }
        catch (const gutil::Exception &)
        {
          delete imagefloat;
          imagefloat=0;

          std::cerr << "Cannot load image: " << list[pos] << std::endl;

          if (down)
          {
            list.erase(list.begin()+pos);

            if (pos > 0 && pos >= list.size())
            {
              pos--;
            }
          }
          else
          {
            list.erase(list.begin()+pos);

            if (pos > 0)
            {
              pos--;
            }
          }
        }
      }
    }
  }

  // watch file

  if (watch_file)
  {
    removeFileWatch(wid);

    if (pos < list.size())
    {
      wid=addFileWatch(list[pos].c_str());
    }
    else
    {
      watch_file=false;
    }
  }

  // set image adapter and title

  if (adapt != 0)
  {
    gutil::Properties prop;
    gimage::getImageIO().loadProperties(prop, list[pos].c_str());

    int rotation, flip;
    prop.getValue("rotation", rotation, "0");
    prop.getValue("flip", flip, "0");

    adapt->setRotationFlip(rotation/90, flip != 0);

    adapt->setScale(scale);

    if (imin < imax && kp == keep_all)
    {
      adapt->setMinIntensity(imin);
      adapt->setMaxIntensity(imax);
    }

    if (w > 0 && h > 0)
    {
      adapt->setMapping(map);
      adapt->setChannel(channel);
      setAdapter(adapt, true, keep_none, w, h, size_max);
    }
    else
    {
      if (kp == keep_none)
      {
        adapt->setMapping(map);
        adapt->setChannel(channel);
      }

      setAdapter(adapt, true, kp);
    }
  }
  else
  {
    setAdapter(0);
  }

  updateTitle();
}